

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void writerpn(uint8_t *rpnexpr,uint32_t *rpnptr,uint8_t *rpn,uint32_t rpnlen)

{
  uint8_t uVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  uint32_t uVar5;
  Symbol *pSVar6;
  ulong uVar7;
  long local_250;
  uint32_t local_244;
  ulong uStack_230;
  uint8_t rpndata;
  size_t offset;
  char symName [512];
  uint32_t rpnlen_local;
  uint8_t *rpn_local;
  uint32_t *rpnptr_local;
  uint8_t *rpnexpr_local;
  
  symName._508_4_ = rpnlen;
  uStack_230 = 0;
  while (uStack_230 < (uint)symName._508_4_) {
    uVar7 = uStack_230 + 1;
    uVar1 = rpn[uStack_230];
    switch(uVar1) {
    case 'P':
      local_250 = 0;
      uStack_230 = uVar7;
      do {
        uVar7 = uStack_230 + 1;
        symName[local_250 + -8] = rpn[uStack_230];
        lVar3 = local_250 + -8;
        local_250 = local_250 + 1;
        uStack_230 = uVar7;
      } while (symName[lVar3] != '\0');
      pSVar6 = sym_FindExactSymbol((char *)&offset);
      uVar5 = getSymbolID(pSVar6);
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = 'P';
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = (uint8_t)uVar5;
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = (uint8_t)(uVar5 >> 8);
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = (uint8_t)(uVar5 >> 0x10);
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = (uint8_t)(uVar5 >> 0x18);
      break;
    case 'Q':
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = 'Q';
      uStack_230 = uVar7;
      do {
        uVar7 = uStack_230 + 1;
        uVar1 = rpn[uStack_230];
        uVar2 = *rpnptr;
        *rpnptr = uVar2 + 1;
        rpnexpr[uVar2] = uVar1;
        uStack_230 = uVar7;
      } while (uVar1 != '\0');
      break;
    default:
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = uVar1;
      uStack_230 = uVar7;
      break;
    case 'S':
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = 'S';
      uStack_230 = uVar7;
      do {
        uVar7 = uStack_230 + 1;
        uVar1 = rpn[uStack_230];
        uVar2 = *rpnptr;
        *rpnptr = uVar2 + 1;
        rpnexpr[uVar2] = uVar1;
        uStack_230 = uVar7;
      } while (uVar1 != '\0');
      break;
    case 'T':
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = 'T';
      uStack_230 = uVar7;
      do {
        uVar7 = uStack_230 + 1;
        uVar1 = rpn[uStack_230];
        uVar2 = *rpnptr;
        *rpnptr = uVar2 + 1;
        rpnexpr[uVar2] = uVar1;
        uStack_230 = uVar7;
      } while (uVar1 != '\0');
      break;
    case 0x80:
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = 0x80;
      uVar1 = rpn[uVar7];
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = uVar1;
      uVar1 = rpn[uStack_230 + 2];
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = uVar1;
      uVar1 = rpn[uStack_230 + 3];
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = uVar1;
      uVar1 = rpn[uStack_230 + 4];
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = uVar1;
      uStack_230 = uStack_230 + 5;
      break;
    case 0x81:
      local_250 = 0;
      uStack_230 = uVar7;
      do {
        uVar7 = uStack_230 + 1;
        symName[local_250 + -8] = rpn[uStack_230];
        lVar3 = local_250 + -8;
        local_250 = local_250 + 1;
        uStack_230 = uVar7;
      } while (symName[lVar3] != '\0');
      pSVar6 = sym_FindExactSymbol((char *)&offset);
      bVar4 = sym_IsConstant(pSVar6);
      if (bVar4) {
        uVar2 = *rpnptr;
        *rpnptr = uVar2 + 1;
        rpnexpr[uVar2] = 0x80;
        local_244 = sym_GetConstantValue((char *)&offset);
      }
      else {
        uVar2 = *rpnptr;
        *rpnptr = uVar2 + 1;
        rpnexpr[uVar2] = 0x81;
        local_244 = getSymbolID(pSVar6);
      }
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = (uint8_t)local_244;
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = (uint8_t)(local_244 >> 8);
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = (uint8_t)(local_244 >> 0x10);
      uVar2 = *rpnptr;
      *rpnptr = uVar2 + 1;
      rpnexpr[uVar2] = (uint8_t)(local_244 >> 0x18);
    }
  }
  return;
}

Assistant:

static void writerpn(uint8_t *rpnexpr, uint32_t *rpnptr, uint8_t *rpn,
		     uint32_t rpnlen)
{
	char symName[512];

	for (size_t offset = 0; offset < rpnlen; ) {
#define popbyte() rpn[offset++]
#define writebyte(byte)	rpnexpr[(*rpnptr)++] = byte
		uint8_t rpndata = popbyte();

		switch (rpndata) {
			struct Symbol *sym;
			uint32_t value;
			uint8_t b;
			size_t i;

		case RPN_CONST:
			writebyte(RPN_CONST);
			writebyte(popbyte());
			writebyte(popbyte());
			writebyte(popbyte());
			writebyte(popbyte());
			break;

		case RPN_SYM:
			i = 0;
			do {
				symName[i] = popbyte();
			} while (symName[i++]);

			// The symbol name is always written expanded
			sym = sym_FindExactSymbol(symName);
			if (sym_IsConstant(sym)) {
				writebyte(RPN_CONST);
				value = sym_GetConstantValue(symName);
			} else {
				writebyte(RPN_SYM);
				value = getSymbolID(sym);
			}

			writebyte(value & 0xFF);
			writebyte(value >> 8);
			writebyte(value >> 16);
			writebyte(value >> 24);
			break;

		case RPN_BANK_SYM:
			i = 0;
			do {
				symName[i] = popbyte();
			} while (symName[i++]);

			// The symbol name is always written expanded
			sym = sym_FindExactSymbol(symName);
			value = getSymbolID(sym);

			writebyte(RPN_BANK_SYM);
			writebyte(value & 0xFF);
			writebyte(value >> 8);
			writebyte(value >> 16);
			writebyte(value >> 24);
			break;

		case RPN_BANK_SECT:
			writebyte(RPN_BANK_SECT);
			do {
				b = popbyte();
				writebyte(b);
			} while (b != 0);
			break;

		case RPN_SIZEOF_SECT:
			writebyte(RPN_SIZEOF_SECT);
			do {
				b = popbyte();
				writebyte(b);
			} while (b != 0);
			break;

		case RPN_STARTOF_SECT:
			writebyte(RPN_STARTOF_SECT);
			do {
				b = popbyte();
				writebyte(b);
			} while (b != 0);
			break;

		default:
			writebyte(rpndata);
			break;
		}
#undef popbyte
#undef writebyte
	}
}